

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O1

API<Args::CmdLine,_Args::AtLeastOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::AtLeastOneGroup,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addMultiArgWithDefaulValues<char_const(&)[3]>
          (API<Args::CmdLine,Args::AtLeastOneGroup,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
           *this,Char flag,char (*name) [3],bool isWithValue,bool isRequired,String *desc,
          String *longDesc,StringList *defaultValues,String *valueSpecifier)

{
  API<Args::CmdLine,_Args::AtLeastOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *pAVar1;
  Arg *this_00;
  ArgPtr local_48;
  API<Args::CmdLine,_Args::AtLeastOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *local_38;
  
  local_38 = (API<Args::CmdLine,_Args::AtLeastOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
              *)this;
  this_00 = (Arg *)operator_new(0x130);
  Arg::Arg<char_const(&)[3]>(this_00,flag,name,isWithValue,isRequired);
  (this_00->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__MultiArg_00172160;
  this_00[1].super_ArgIface._vptr_ArgIface = (_func_int **)0x0;
  this_00[1].super_ArgIface.m_cmdLine = (CmdLine *)0x0;
  this_00[1].m_isWithValue = false;
  this_00[1].m_isRequired = false;
  this_00[1].m_isDefined = false;
  *(undefined5 *)&this_00[1].field_0x13 = 0;
  this_00[1].m_value._M_dataplus._M_p = (pointer)0x0;
  this_00[1].m_value._M_string_length = 0;
  this_00[1].m_value.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[1].m_value.field_2 + 8) = 0;
  if (desc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_description);
  }
  if (longDesc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_longDescription);
  }
  if ((defaultValues->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (defaultValues->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_00[1].m_value._M_string_length,defaultValues);
  }
  if (valueSpecifier->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_valueSpecifier);
  }
  pAVar1 = local_38;
  local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete =
       (_Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>)(Deleter<Args::ArgIface>)0x1;
  local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl = (ArgIface *)this_00;
  GroupIface::addArg(&local_38->m_self->super_GroupIface,&local_48);
  if (((Arg *)local_48._M_t.
              super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
              super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
              super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl != (Arg *)0x0) &&
     (local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
      _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
      super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
      super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete ==
      (Deleter<Args::ArgIface>)0x1)) {
    (*((ArgIface *)
      &(local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>
        ._M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
        super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface)->
      _vptr_ArgIface[1])();
  }
  return pAVar1;
}

Assistant:

API< PARENT, SELF, ARGPTR, false > & addMultiArgWithDefaulValues(
		//! Flag for this argument.
		Char flag,
		//! Name for this argument.
		NAME && name,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const StringList & defaultValues = StringList(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< MultiArg, details::Deleter< ArgIface > > (
			new MultiArg( flag, std::forward< NAME > ( name ), isWithValue,
				isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValues.empty() )
			arg->setDefaultValues( defaultValues );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return *this;
	}